

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeFaceGaussianCurvatures
          (IntrinsicGeometryInterface *this)

{
  unsigned_long uVar1;
  size_t i;
  runtime_error *this_00;
  unsigned_long uVar2;
  int iVar3;
  bool bVar4;
  double dVar5;
  allocator local_161;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  MeshData<geometrycentral::surface::Face,_double> local_70;
  RangeSetBase<geometrycentral::surface::FaceRangeF> local_38;
  
  DependentQuantity::ensureHave(&(this->cornerScaledAnglesQ).super_DependentQuantity);
  MeshData<geometrycentral::surface::Face,_double>::MeshData
            (&local_70,(this->super_BaseGeometryInterface).mesh);
  MeshData<geometrycentral::surface::Face,_double>::operator=
            (&this->faceGaussianCurvatures,&local_70);
  MeshData<geometrycentral::surface::Face,_double>::~MeshData(&local_70);
  local_38.mesh = (this->super_BaseGeometryInterface).mesh;
  local_38.iEnd = (local_38.mesh)->nFacesFillCount;
  local_38.iStart = 0;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin(&__begin2,&local_38);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end(&__end2,&local_38);
  while( true ) {
    if (__begin2.iCurr == __end2.iCurr) {
      return;
    }
    dVar5 = -3.141592653589793;
    iVar3 = 3;
    uVar1 = ((__begin2.mesh)->fHalfedgeArr).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[__begin2.iCurr];
    uVar2 = uVar1;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
      dVar5 = dVar5 + (this->cornerScaledAngles).data.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data[uVar2];
      uVar2 = ((__begin2.mesh)->heNextArr).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar2];
    }
    if (uVar2 != uVar1) break;
    (this->faceGaussianCurvatures).data.
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[__begin2.iCurr]
         = dVar5;
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++(&__begin2);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]nonmanifold-laplacian/deps/geometry-central/src/surface/intrinsic_geometry_interface.cpp"
             ,&local_161);
  ::std::operator+(&local_108,"GC_SAFETY_ASSERT FAILURE from ",&local_128);
  ::std::operator+(&local_e8,&local_108,":");
  ::std::__cxx11::to_string(&local_148,0xc6);
  ::std::operator+(&local_c8,&local_e8,&local_148);
  ::std::operator+(&local_a8,&local_c8," - ");
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                   &local_a8,"faces mush be triangular");
  ::std::runtime_error::runtime_error(this_00,(string *)&local_70);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void IntrinsicGeometryInterface::computeFaceGaussianCurvatures() {
  cornerScaledAnglesQ.ensureHave();

  faceGaussianCurvatures = FaceData<double>(mesh);

  for (Face f : mesh.faces()) {

    double angleDefect = -PI;
    Halfedge he = f.halfedge();
    for (int i = 0; i < 3; i++) {
      angleDefect += cornerScaledAngles[he.corner()];
      he = he.next();
    }
    GC_SAFETY_ASSERT(he == f.halfedge(), "faces mush be triangular");

    faceGaussianCurvatures[f] = angleDefect;
  }
}